

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TPZTriangleSphere.h
# Opt level: O2

void __thiscall
pzgeom::TPZTriangleSphere<pzgeom::TPZGeoTriangle>::GradX<Fad<double>>
          (TPZTriangleSphere<pzgeom::TPZGeoTriangle> *this,TPZFMatrix<double> *cornerco,
          TPZVec<Fad<double>_> *par,TPZFMatrix<Fad<double>_> *gradx)

{
  Fad<double> *pFVar1;
  int i;
  long row;
  long lVar2;
  Fad<double> a;
  undefined1 local_ad0 [144];
  Fad<double> b;
  undefined1 local_a20 [16];
  Fad<double> NormValue;
  Fad<double> local_9f0;
  Fad<double> local_9d0;
  TPZVec<double> Xc;
  TPZFMatrix<Fad<double>_> local_990;
  TPZFNMatrix<3,_Fad<double>_> XtminusXc;
  TPZManVector<Fad<double>,_3> XTriangle;
  TPZFNMatrix<9,_Fad<double>_> GradXt;
  TPZFNMatrix<9,_Fad<double>_> GradOneoverNorm;
  TPZFNMatrix<9,_Fad<double>_> TensorXtGradX;
  TPZFNMatrix<9,_Fad<double>_> GradXtScaled;
  
  GradOneoverNorm.super_TPZFMatrix<Fad<double>_>.super_TPZMatrix<Fad<double>_>.super_TPZBaseMatrix.
  super_TPZSavable._vptr_TPZSavable = (_func_int **)0x0;
  GradOneoverNorm.super_TPZFMatrix<Fad<double>_>.super_TPZMatrix<Fad<double>_>.super_TPZBaseMatrix.
  fRow._0_4_ = 0;
  GradOneoverNorm.super_TPZFMatrix<Fad<double>_>.super_TPZMatrix<Fad<double>_>.super_TPZBaseMatrix.
  fCol = 0;
  GradOneoverNorm.super_TPZFMatrix<Fad<double>_>.super_TPZMatrix<Fad<double>_>.super_TPZBaseMatrix.
  fDecomposed = '\0';
  GradOneoverNorm.super_TPZFMatrix<Fad<double>_>.super_TPZMatrix<Fad<double>_>.super_TPZBaseMatrix.
  fDefPositive = '\0';
  GradOneoverNorm.super_TPZFMatrix<Fad<double>_>.super_TPZMatrix<Fad<double>_>.super_TPZBaseMatrix.
  _26_6_ = 0;
  TPZManVector<Fad<double>,_3>::TPZManVector(&XTriangle,3,(Fad<double> *)&GradOneoverNorm);
  Fad<double>::~Fad((Fad<double> *)&GradOneoverNorm);
  TensorXtGradX.super_TPZFMatrix<Fad<double>_>.super_TPZMatrix<Fad<double>_>.super_TPZBaseMatrix.
  super_TPZSavable._vptr_TPZSavable = (_func_int **)0x0;
  TensorXtGradX.super_TPZFMatrix<Fad<double>_>.super_TPZMatrix<Fad<double>_>.super_TPZBaseMatrix.
  fRow._0_4_ = 0;
  TensorXtGradX.super_TPZFMatrix<Fad<double>_>.super_TPZMatrix<Fad<double>_>.super_TPZBaseMatrix.
  fCol = 0;
  TensorXtGradX.super_TPZFMatrix<Fad<double>_>.super_TPZMatrix<Fad<double>_>.super_TPZBaseMatrix.
  fDecomposed = '\0';
  TensorXtGradX.super_TPZFMatrix<Fad<double>_>.super_TPZMatrix<Fad<double>_>.super_TPZBaseMatrix.
  fDefPositive = '\0';
  TensorXtGradX.super_TPZFMatrix<Fad<double>_>.super_TPZMatrix<Fad<double>_>.super_TPZBaseMatrix.
  _26_6_ = 0;
  TPZFNMatrix<9,_Fad<double>_>::TPZFNMatrix(&GradOneoverNorm,3,1,(Fad<double> *)&TensorXtGradX);
  Fad<double>::~Fad((Fad<double> *)&TensorXtGradX);
  GradXtScaled.super_TPZFMatrix<Fad<double>_>.super_TPZMatrix<Fad<double>_>.super_TPZBaseMatrix.
  super_TPZSavable._vptr_TPZSavable = (_func_int **)0x0;
  GradXtScaled.super_TPZFMatrix<Fad<double>_>.super_TPZMatrix<Fad<double>_>.super_TPZBaseMatrix.fRow
  ._0_4_ = 0;
  GradXtScaled.super_TPZFMatrix<Fad<double>_>.super_TPZMatrix<Fad<double>_>.super_TPZBaseMatrix.fCol
       = 0;
  GradXtScaled.super_TPZFMatrix<Fad<double>_>.super_TPZMatrix<Fad<double>_>.super_TPZBaseMatrix.
  fDecomposed = '\0';
  GradXtScaled.super_TPZFMatrix<Fad<double>_>.super_TPZMatrix<Fad<double>_>.super_TPZBaseMatrix.
  fDefPositive = '\0';
  GradXtScaled.super_TPZFMatrix<Fad<double>_>.super_TPZMatrix<Fad<double>_>.super_TPZBaseMatrix.
  _26_6_ = 0;
  TPZFNMatrix<9,_Fad<double>_>::TPZFNMatrix(&TensorXtGradX,3,2,(Fad<double> *)&GradXtScaled);
  Fad<double>::~Fad((Fad<double> *)&GradXtScaled);
  GradXt.super_TPZFMatrix<Fad<double>_>.super_TPZMatrix<Fad<double>_>.super_TPZBaseMatrix.
  super_TPZSavable._vptr_TPZSavable = (_func_int **)0x0;
  GradXt.super_TPZFMatrix<Fad<double>_>.super_TPZMatrix<Fad<double>_>.super_TPZBaseMatrix.fRow =
       (ulong)GradXt.super_TPZFMatrix<Fad<double>_>.super_TPZMatrix<Fad<double>_>.
              super_TPZBaseMatrix.fRow._4_4_ << 0x20;
  GradXt.super_TPZFMatrix<Fad<double>_>.super_TPZMatrix<Fad<double>_>.super_TPZBaseMatrix.fCol = 0;
  GradXt.super_TPZFMatrix<Fad<double>_>.super_TPZMatrix<Fad<double>_>.super_TPZBaseMatrix.
  fDecomposed = '\0';
  GradXt.super_TPZFMatrix<Fad<double>_>.super_TPZMatrix<Fad<double>_>.super_TPZBaseMatrix.
  fDefPositive = '\0';
  GradXt.super_TPZFMatrix<Fad<double>_>.super_TPZMatrix<Fad<double>_>.super_TPZBaseMatrix._26_6_ = 0
  ;
  TPZFNMatrix<9,_Fad<double>_>::TPZFNMatrix(&GradXtScaled,3,3,(Fad<double> *)&GradXt);
  Fad<double>::~Fad((Fad<double> *)&GradXt);
  TPZGeoTriangle::X<Fad<double>>(cornerco,par,&XTriangle.super_TPZVec<Fad<double>_>);
  GradXt.super_TPZFMatrix<Fad<double>_>.super_TPZMatrix<Fad<double>_>.super_TPZBaseMatrix.
  super_TPZSavable._vptr_TPZSavable = (_func_int **)0x0;
  GradXt.super_TPZFMatrix<Fad<double>_>.super_TPZMatrix<Fad<double>_>.super_TPZBaseMatrix.fRow =
       GradXt.super_TPZFMatrix<Fad<double>_>.super_TPZMatrix<Fad<double>_>.super_TPZBaseMatrix.fRow
       & 0xffffffff00000000;
  GradXt.super_TPZFMatrix<Fad<double>_>.super_TPZMatrix<Fad<double>_>.super_TPZBaseMatrix.fCol = 0;
  GradXt.super_TPZFMatrix<Fad<double>_>.super_TPZMatrix<Fad<double>_>.super_TPZBaseMatrix.
  fDecomposed = '\0';
  GradXt.super_TPZFMatrix<Fad<double>_>.super_TPZMatrix<Fad<double>_>.super_TPZBaseMatrix.
  fDefPositive = '\0';
  GradXt.super_TPZFMatrix<Fad<double>_>.super_TPZMatrix<Fad<double>_>.super_TPZBaseMatrix._26_6_ = 0
  ;
  TPZFNMatrix<3,_Fad<double>_>::TPZFNMatrix(&XtminusXc,3,1,(Fad<double> *)&GradXt);
  Fad<double>::~Fad((Fad<double> *)&GradXt);
  TPZVec<double>::TPZVec(&Xc,&this->fXc);
  lVar2 = 0;
  for (row = 0; row < XTriangle.super_TPZVec<Fad<double>_>.fNElements; row = row + 1) {
    GradXt.super_TPZFMatrix<Fad<double>_>.super_TPZMatrix<Fad<double>_>.super_TPZBaseMatrix.
    super_TPZSavable._vptr_TPZSavable =
         (_func_int **)((long)&(XTriangle.super_TPZVec<Fad<double>_>.fStore)->val_ + lVar2);
    GradXt.super_TPZFMatrix<Fad<double>_>.super_TPZMatrix<Fad<double>_>.super_TPZBaseMatrix.fRow =
         (int64_t)Xc.fStore[row];
    GradXt.super_TPZFMatrix<Fad<double>_>.super_TPZMatrix<Fad<double>_>.super_TPZBaseMatrix.fCol = 0
    ;
    pFVar1 = TPZFMatrix<Fad<double>_>::operator()(&XtminusXc.super_TPZFMatrix<Fad<double>_>,row,0);
    Fad<double>::operator=(pFVar1,(FadExpr<FadBinaryMinus<Fad<double>,_FadCst<double>_>_> *)&GradXt)
    ;
    lVar2 = lVar2 + 0x20;
  }
  NormValue.val_ = Norm(&XtminusXc.super_TPZFMatrix<Fad<double>_>);
  NormValue.dx_.num_elts = 0;
  NormValue.dx_.ptr_to_data = (double *)0x0;
  NormValue.defaultVal = 0.0;
  TPZFNMatrix<9,_Fad<double>_>::TPZFNMatrix(&GradXt);
  TPZGeoTriangle::GradX<Fad<double>>(cornerco,par,&GradXt.super_TPZFMatrix<Fad<double>_>);
  pFVar1 = TPZFMatrix<Fad<double>_>::operator()(&XtminusXc.super_TPZFMatrix<Fad<double>_>,0,0);
  a.dx_._0_8_ = TPZFMatrix<Fad<double>_>::operator()(&GradXt.super_TPZFMatrix<Fad<double>_>,0,0);
  a.val_ = (double)pFVar1;
  pFVar1 = TPZFMatrix<Fad<double>_>::operator()(&XtminusXc.super_TPZFMatrix<Fad<double>_>,1,0);
  b.dx_._0_8_ = TPZFMatrix<Fad<double>_>::operator()(&GradXt.super_TPZFMatrix<Fad<double>_>,1,0);
  b.val_ = (double)pFVar1;
  local_990.super_TPZMatrix<Fad<double>_>.super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable =
       (_func_int **)&a;
  local_990.super_TPZMatrix<Fad<double>_>.super_TPZBaseMatrix.fRow = (int64_t)&b;
  pFVar1 = TPZFMatrix<Fad<double>_>::operator()(&XtminusXc.super_TPZFMatrix<Fad<double>_>,2,0);
  local_a20._8_8_ = TPZFMatrix<Fad<double>_>::operator()(&GradXt.super_TPZFMatrix<Fad<double>_>,2,0)
  ;
  local_ad0._0_8_ = &local_990;
  local_ad0._8_8_ = (Fad<double> *)local_a20;
  local_a20._0_8_ = pFVar1;
  pFVar1 = TPZFMatrix<Fad<double>_>::operator()(&GradOneoverNorm.super_TPZFMatrix<Fad<double>_>,0,0)
  ;
  Fad<double>::operator=
            (pFVar1,(FadExpr<FadBinaryAdd<FadExpr<FadBinaryAdd<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>,_FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>_>_>,_FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>_>_>
                     *)local_ad0);
  pFVar1 = TPZFMatrix<Fad<double>_>::operator()(&XtminusXc.super_TPZFMatrix<Fad<double>_>,0,0);
  a.dx_._0_8_ = TPZFMatrix<Fad<double>_>::operator()(&GradXt.super_TPZFMatrix<Fad<double>_>,0,1);
  a.val_ = (double)pFVar1;
  pFVar1 = TPZFMatrix<Fad<double>_>::operator()(&XtminusXc.super_TPZFMatrix<Fad<double>_>,1,0);
  b.dx_._0_8_ = TPZFMatrix<Fad<double>_>::operator()(&GradXt.super_TPZFMatrix<Fad<double>_>,1,1);
  b.val_ = (double)pFVar1;
  local_990.super_TPZMatrix<Fad<double>_>.super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable =
       (_func_int **)&a;
  local_990.super_TPZMatrix<Fad<double>_>.super_TPZBaseMatrix.fRow = (int64_t)&b;
  pFVar1 = TPZFMatrix<Fad<double>_>::operator()(&XtminusXc.super_TPZFMatrix<Fad<double>_>,2,0);
  local_a20._8_8_ = TPZFMatrix<Fad<double>_>::operator()(&GradXt.super_TPZFMatrix<Fad<double>_>,2,1)
  ;
  local_ad0._0_8_ = &local_990;
  local_ad0._8_8_ = (Fad<double> *)local_a20;
  local_a20._0_8_ = pFVar1;
  pFVar1 = TPZFMatrix<Fad<double>_>::operator()(&GradOneoverNorm.super_TPZFMatrix<Fad<double>_>,1,0)
  ;
  Fad<double>::operator=
            (pFVar1,(FadExpr<FadBinaryAdd<FadExpr<FadBinaryAdd<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>,_FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>_>_>,_FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>_>_>
                     *)local_ad0);
  local_ad0._0_8_ = &local_990;
  local_ad0._8_8_ = &NormValue;
  local_990.super_TPZMatrix<Fad<double>_>.super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable =
       (_func_int **)&NormValue;
  local_990.super_TPZMatrix<Fad<double>_>.super_TPZBaseMatrix.fRow = (int64_t)&NormValue;
  Fad<double>::Fad<FadBinaryMul<FadExpr<FadBinaryMul<Fad<double>,Fad<double>>>,Fad<double>>>
            (&a,(FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>,_Fad<double>_>_>
                 *)local_ad0);
  local_ad0._8_8_ = (ulong)this->fR ^ 0x8000000000000000;
  local_ad0._16_8_ = 0.0;
  local_ad0._24_8_ = &a;
  Fad<double>::Fad<FadBinaryDiv<FadCst<double>,Fad<double>>>
            (&b,(FadExpr<FadBinaryDiv<FadCst<double>,_Fad<double>_>_> *)local_ad0);
  Fad<double>::Fad(&local_9d0,&b);
  ::operator*((TPZFMatrix<Fad<double>_> *)local_ad0,&local_9d0,
              &GradOneoverNorm.super_TPZFMatrix<Fad<double>_>);
  TPZFMatrix<Fad<double>_>::operator=
            (&GradOneoverNorm.super_TPZFMatrix<Fad<double>_>,(TPZFMatrix<Fad<double>_> *)local_ad0);
  TPZFMatrix<Fad<double>_>::~TPZFMatrix((TPZFMatrix<Fad<double>_> *)local_ad0);
  Fad<double>::~Fad(&local_9d0);
  pFVar1 = TPZFMatrix<Fad<double>_>::operator()(&XtminusXc.super_TPZFMatrix<Fad<double>_>,0,0);
  local_ad0._8_8_ =
       TPZFMatrix<Fad<double>_>::operator()(&GradOneoverNorm.super_TPZFMatrix<Fad<double>_>,0,0);
  local_ad0._0_8_ = pFVar1;
  pFVar1 = TPZFMatrix<Fad<double>_>::operator()(&TensorXtGradX.super_TPZFMatrix<Fad<double>_>,0,0);
  Fad<double>::operator=(pFVar1,(FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_> *)local_ad0);
  pFVar1 = TPZFMatrix<Fad<double>_>::operator()(&XtminusXc.super_TPZFMatrix<Fad<double>_>,0,0);
  local_ad0._8_8_ =
       TPZFMatrix<Fad<double>_>::operator()(&GradOneoverNorm.super_TPZFMatrix<Fad<double>_>,1,0);
  local_ad0._0_8_ = pFVar1;
  pFVar1 = TPZFMatrix<Fad<double>_>::operator()(&TensorXtGradX.super_TPZFMatrix<Fad<double>_>,0,1);
  Fad<double>::operator=(pFVar1,(FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_> *)local_ad0);
  pFVar1 = TPZFMatrix<Fad<double>_>::operator()(&XtminusXc.super_TPZFMatrix<Fad<double>_>,1,0);
  local_ad0._8_8_ =
       TPZFMatrix<Fad<double>_>::operator()(&GradOneoverNorm.super_TPZFMatrix<Fad<double>_>,0,0);
  local_ad0._0_8_ = pFVar1;
  pFVar1 = TPZFMatrix<Fad<double>_>::operator()(&TensorXtGradX.super_TPZFMatrix<Fad<double>_>,1,0);
  Fad<double>::operator=(pFVar1,(FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_> *)local_ad0);
  pFVar1 = TPZFMatrix<Fad<double>_>::operator()(&XtminusXc.super_TPZFMatrix<Fad<double>_>,1,0);
  local_ad0._8_8_ =
       TPZFMatrix<Fad<double>_>::operator()(&GradOneoverNorm.super_TPZFMatrix<Fad<double>_>,1,0);
  local_ad0._0_8_ = pFVar1;
  pFVar1 = TPZFMatrix<Fad<double>_>::operator()(&TensorXtGradX.super_TPZFMatrix<Fad<double>_>,1,1);
  Fad<double>::operator=(pFVar1,(FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_> *)local_ad0);
  pFVar1 = TPZFMatrix<Fad<double>_>::operator()(&XtminusXc.super_TPZFMatrix<Fad<double>_>,2,0);
  local_ad0._8_8_ =
       TPZFMatrix<Fad<double>_>::operator()(&GradOneoverNorm.super_TPZFMatrix<Fad<double>_>,0,0);
  local_ad0._0_8_ = pFVar1;
  pFVar1 = TPZFMatrix<Fad<double>_>::operator()(&TensorXtGradX.super_TPZFMatrix<Fad<double>_>,2,0);
  Fad<double>::operator=(pFVar1,(FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_> *)local_ad0);
  pFVar1 = TPZFMatrix<Fad<double>_>::operator()(&XtminusXc.super_TPZFMatrix<Fad<double>_>,2,0);
  local_ad0._8_8_ =
       TPZFMatrix<Fad<double>_>::operator()(&GradOneoverNorm.super_TPZFMatrix<Fad<double>_>,1,0);
  local_ad0._0_8_ = pFVar1;
  pFVar1 = TPZFMatrix<Fad<double>_>::operator()(&TensorXtGradX.super_TPZFMatrix<Fad<double>_>,2,1);
  Fad<double>::operator=(pFVar1,(FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_> *)local_ad0);
  local_ad0._8_8_ = this->fR;
  local_ad0._16_8_ = 0.0;
  local_ad0._24_8_ = &NormValue;
  Fad<double>::operator=(&a,(FadExpr<FadBinaryDiv<FadCst<double>,_Fad<double>_>_> *)local_ad0);
  Fad<double>::Fad(&local_9f0,&a);
  ::operator*(&local_990,&local_9f0,&GradXt.super_TPZFMatrix<Fad<double>_>);
  TPZFMatrix<Fad<double>_>::operator+
            ((TPZFMatrix<Fad<double>_> *)local_ad0,&local_990,
             &TensorXtGradX.super_TPZFMatrix<Fad<double>_>);
  TPZFMatrix<Fad<double>_>::operator=(gradx,(TPZFMatrix<Fad<double>_> *)local_ad0);
  TPZFMatrix<Fad<double>_>::~TPZFMatrix((TPZFMatrix<Fad<double>_> *)local_ad0);
  TPZFMatrix<Fad<double>_>::~TPZFMatrix(&local_990);
  Fad<double>::~Fad(&local_9f0);
  Fad<double>::~Fad(&b);
  Fad<double>::~Fad(&a);
  TPZFNMatrix<9,_Fad<double>_>::~TPZFNMatrix(&GradXt);
  Fad<double>::~Fad(&NormValue);
  TPZVec<double>::~TPZVec(&Xc);
  TPZFNMatrix<3,_Fad<double>_>::~TPZFNMatrix(&XtminusXc);
  TPZFNMatrix<9,_Fad<double>_>::~TPZFNMatrix(&GradXtScaled);
  TPZFNMatrix<9,_Fad<double>_>::~TPZFNMatrix(&TensorXtGradX);
  TPZFNMatrix<9,_Fad<double>_>::~TPZFNMatrix(&GradOneoverNorm);
  TPZManVector<Fad<double>,_3>::~TPZManVector(&XTriangle);
  return;
}

Assistant:

void GradX(TPZFMatrix<REAL> &cornerco, TPZVec<T> &par, TPZFMatrix<T> &gradx) const
        {
            TPZManVector<T,3> XTriangle(3,0.0);
            TPZFNMatrix<9,T> GradOneoverNorm(3,1,0.0);
            TPZFNMatrix<9,T> TensorXtGradX(3,2,0.0);
            TPZFNMatrix<9,T> GradXtScaled(3,3,0.0);
            
            //            TPZFNMatrix<3*NNodes> coord(3,NNodes);
            //            CornerCoordinates(gel, coord);
            
            GeomTriang::X(cornerco,par,XTriangle);
            TPZFNMatrix<3,T> XtminusXc(3,1,0.0);
            TPZVec<REAL> Xc= fXc;
            
            for (int i = 0; i < XTriangle.size(); i++)
            { XtminusXc(i,0)= XTriangle[i] - Xc[i]; }
            T NormValue = Norm(XtminusXc);
            
            
            TPZFNMatrix<9,T> GradXt;
            GeomTriang::GradX(cornerco,par,GradXt);
            
            GradOneoverNorm(0,0) = XtminusXc(0,0)*GradXt(0,0)+XtminusXc(1,0)*GradXt(1,0)+XtminusXc(2,0)*GradXt(2,0);
            GradOneoverNorm(1,0) = XtminusXc(0,0)*GradXt(0,1)+XtminusXc(1,0)*GradXt(1,1)+XtminusXc(2,0)*GradXt(2,1);
            T a = (NormValue*NormValue*NormValue);
            T b = -fR/a;
            GradOneoverNorm = b*GradOneoverNorm;
            
            TensorXtGradX(0,0)= XtminusXc(0,0)*GradOneoverNorm(0,0);
            TensorXtGradX(0,1)= XtminusXc(0,0)*GradOneoverNorm(1,0);
            TensorXtGradX(1,0)= XtminusXc(1,0)*GradOneoverNorm(0,0);
            TensorXtGradX(1,1)= XtminusXc(1,0)*GradOneoverNorm(1,0);
            TensorXtGradX(2,0)= XtminusXc(2,0)*GradOneoverNorm(0,0);
            TensorXtGradX(2,1)= XtminusXc(2,0)*GradOneoverNorm(1,0);
            a = fR/NormValue;
            gradx=a*GradXt+TensorXtGradX;

        }